

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int greatest_name_match(char *name,char *filter)

{
  int iVar1;
  size_t __n;
  
  __n = strlen(filter);
  while( true ) {
    if (*name == '\0') {
      return 0;
    }
    if ((*name == *filter) && (iVar1 = strncmp(name,filter,__n), iVar1 == 0)) break;
    name = name + 1;
  }
  return 1;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}